

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

RTPTime __thiscall
jrtplib::RTCPScheduler::CalculateTransmissionInterval(RTCPScheduler *this,bool sender)

{
  double dVar1;
  double extraout_XMM0_Qa;
  double T;
  double mul;
  double td;
  RTPTime Td;
  bool sender_local;
  RTCPScheduler *this_local;
  
  Td.m_t._7_1_ = sender;
  td = (double)CalculateDeterministicInterval(this,sender);
  dVar1 = RTPTime::GetDouble((RTPTime *)&td);
  (*this->rtprand->_vptr_RTPRandom[5])();
  RTPTime::RTPTime((RTPTime *)&this_local,(dVar1 * (extraout_XMM0_Qa + 0.5)) / 1.21828);
  return (RTPTime)(double)this_local;
}

Assistant:

RTPTime RTCPScheduler::CalculateTransmissionInterval(bool sender)
{
	RTPTime Td = CalculateDeterministicInterval(sender);
	double td,mul,T;

//	std::cout << "CalculateTransmissionInterval" << std::endl;

	td = Td.GetDouble();
	mul = rtprand.GetRandomDouble()+0.5; // gives random value between 0.5 and 1.5
	T = (td*mul)/1.21828; // see RFC 3550 p 30

//	std::cout << "  Td: " << td << std::endl;
//	std::cout << "  mul: " << mul << std::endl;
//	std::cout << "  T: " << T << std::endl;

	return RTPTime(T);
}